

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O2

bool __thiscall
glcts::anon_unknown_0::BasicResourceImage::RunIteration
          (BasicResourceImage *this,uvec3 *param_1,uvec3 *num_groups,bool dispatch_indirect)

{
  CallLogWrapper *this_00;
  GLuint *textures;
  pointer *ppVVar1;
  undefined4 uVar2;
  RenderTarget *pRVar3;
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [16];
  bool bVar9;
  int i_1;
  GLuint GVar10;
  uint height;
  int iVar11;
  ostream *poVar12;
  vec4 *epsilon;
  bool *compile_error;
  uint width;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  ulong uVar16;
  ulong uVar17;
  int i;
  long lVar18;
  ulong uVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  vector<unsigned_char,_std::allocator<unsigned_char>_> colorData;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> display;
  vec4 local_1d8;
  vec4 kColorEps;
  vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> data;
  
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  tcu::operator*((tcu *)&colorData,param_1,num_groups);
  std::__cxx11::stringstream::stringstream((stringstream *)&data);
  bVar9 = glu::ContextInfo::isExtensionSupported
                    (((this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.m_context)->
                     m_contextInfo,"GL_OES_shader_image_atomic");
  if (bVar9) {
    std::operator<<((ostream *)
                    &data.
                     super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    "\n#extension GL_OES_shader_image_atomic : enable");
  }
  ppVVar1 = &data.
             super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  poVar12 = std::operator<<((ostream *)ppVVar1,"\nlayout(local_size_x = ");
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  poVar12 = std::operator<<(poVar12,", local_size_y = ");
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  poVar12 = std::operator<<(poVar12,", local_size_z = ");
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  poVar12 = std::operator<<(poVar12,
                            ") in;\nlayout(r32ui, binding=0) coherent uniform mediump uimage2D g_image1;\nlayout(r32ui, binding=1) uniform mediump uimage2D g_image2;\nconst uvec3 kGlobalSize = uvec3("
                           );
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  poVar12 = std::operator<<(poVar12,", ");
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  poVar12 = std::operator<<(poVar12,", ");
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::operator<<(poVar12,
                  ");\nvoid main() {\n  if (gl_GlobalInvocationID.x >= kGlobalSize.x || gl_GlobalInvocationID.y >= kGlobalSize.y) return;\n  uvec4 color = uvec4(gl_GlobalInvocationID.x + gl_GlobalInvocationID.y);"
                 );
  bVar9 = glu::ContextInfo::isExtensionSupported
                    (((this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.m_context)->
                     m_contextInfo,"GL_OES_shader_image_atomic");
  if (bVar9) {
    anon_unknown_0::Output("Using imageAtomicAdd");
    pcVar15 = 
    "\n  imageStore(g_image1, ivec2(gl_GlobalInvocationID), uvec4(0));\n  imageAtomicAdd(g_image1, ivec2(gl_GlobalInvocationID), color.x);\n  uvec4 c = imageLoad(g_image1, ivec2(gl_GlobalInvocationID));\n  imageStore(g_image2, ivec2(gl_GlobalInvocationID), c);\n}"
    ;
  }
  else {
    anon_unknown_0::Output("Function imageAtomicAdd not supported, using imageStore");
    pcVar15 = 
    "\n  imageStore(g_image1, ivec2(gl_GlobalInvocationID), color);\n  uvec4 c = imageLoad(g_image1, ivec2(gl_GlobalInvocationID));\n  imageStore(g_image2, ivec2(gl_GlobalInvocationID), c);\n}"
    ;
  }
  std::operator<<((ostream *)ppVVar1,pcVar15);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&data);
  GVar10 = ComputeShaderBase::CreateComputeProgram
                     (&this->super_ComputeShaderBase,(string *)&display);
  this->m_program = GVar10;
  std::__cxx11::string::~string((string *)&display);
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar9 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  if (bVar9) {
    width = num_groups->m_data[0] * param_1->m_data[0];
    height = num_groups->m_data[1] * param_1->m_data[1];
    iVar11 = height * width;
    std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
    vector(&data,(ulong)(num_groups->m_data[2] * param_1->m_data[2] * iVar11),
           (allocator_type *)&display);
    textures = this->m_texture;
    glu::CallLogWrapper::glGenTextures(this_00,2,textures);
    for (lVar18 = 0; lVar18 != 2; lVar18 = lVar18 + 1) {
      glu::CallLogWrapper::glBindTexture(this_00,0xde1,textures[lVar18]);
      glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
      glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,0x8236,width,height);
      glu::CallLogWrapper::glTexSubImage2D
                (this_00,0xde1,0,0,0,width,height,0x8d94,0x1405,
                 data.
                 super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    }
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
    glu::CallLogWrapper::glBindImageTexture(this_00,0,*textures,0,'\0',0,0x88ba,0x8236);
    glu::CallLogWrapper::glBindImageTexture(this_00,1,this->m_texture[1],0,'\0',0,0x88b9,0x8236);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    if (dispatch_indirect) {
      GVar10 = this->m_dispatch_buffer;
      if (GVar10 == 0) {
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
        GVar10 = this->m_dispatch_buffer;
      }
      glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,GVar10);
      glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,num_groups,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
    }
    else {
      glu::CallLogWrapper::glDispatchCompute
                (this_00,num_groups->m_data[0],num_groups->m_data[1],num_groups->m_data[2]);
    }
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x20);
    glu::CallLogWrapper::glClear(this_00,0x4000);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c0);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,*textures);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c1);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_texture[1]);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_draw_program);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
    glu::CallLogWrapper::glViewport(this_00,0,0,width,height);
    glu::CallLogWrapper::glDrawArraysInstanced(this_00,5,0,4,1);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&display,(long)iVar11,(allocator_type *)&colorData);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&colorData,(long)(iVar11 * 4),(allocator_type *)&kColorEps);
    epsilon = (vec4 *)colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
    glu::CallLogWrapper::glReadPixels
              (this_00,0,0,width,height,0x1908,0x1401,
               colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glDeleteTextures(this_00,2,textures);
    auVar8 = _DAT_0167ea80;
    for (lVar18 = 0; lVar18 < iVar11 * 4; lVar18 = lVar18 + 4) {
      uVar2 = *(undefined4 *)
               (colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start + lVar18);
      uVar16 = (ulong)(ushort)uVar2 & 0xffffffffffff00ff;
      auVar4._8_4_ = 0;
      auVar4._0_8_ = uVar16;
      auVar4[0xc] = (char)((uint)uVar2 >> 0x18);
      auVar5[8] = (char)((uint)uVar2 >> 0x10);
      auVar5._0_8_ = uVar16;
      auVar5[9] = 0;
      auVar5._10_3_ = auVar4._10_3_;
      auVar7._5_8_ = 0;
      auVar7._0_5_ = auVar5._8_5_;
      auVar6[4] = (char)((uint)uVar2 >> 8);
      auVar6._0_4_ = (int)uVar16;
      auVar6[5] = 0;
      auVar6._6_7_ = SUB137(auVar7 << 0x40,6);
      auVar22._0_8_ = (double)(int)uVar16;
      auVar22._8_8_ = (double)auVar6._4_4_;
      auVar21._0_8_ = (double)auVar5._8_4_;
      auVar21._8_8_ = (double)(uint3)(auVar4._10_3_ >> 0x10);
      auVar21 = divpd(auVar21,auVar8);
      auVar22 = divpd(auVar22,auVar8);
      *(ulong *)display.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start[(int)lVar18 >> 2].m_data =
           CONCAT44((float)auVar22._8_8_,(float)auVar22._0_8_);
      *(ulong *)(display.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[(int)lVar18 >> 2].m_data + 2) =
           CONCAT44((float)auVar21._8_8_,(float)auVar21._0_8_);
      epsilon = (vec4 *)colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
    }
    tcu::Vector<float,_4>::Vector(&kColorEps,&(this->super_ComputeShaderBase).g_color_eps);
    kColorEps.m_data[0] = kColorEps.m_data[0] + 0.003921569;
    pRVar3 = (this->super_ComputeShaderBase).renderTarget;
    uVar16 = 0;
    uVar19 = 0;
    if (0 < (int)width) {
      uVar19 = (ulong)width;
    }
    uVar14 = (ulong)height;
    if ((int)height < 1) {
      uVar14 = uVar16;
    }
    for (uVar13 = 0; uVar13 != uVar14; uVar13 = uVar13 + 1) {
      for (uVar17 = 0; uVar19 != uVar17; uVar17 = uVar17 + 1) {
        if (((long)uVar13 < (long)pRVar3->m_height) && ((long)uVar17 < (long)pRVar3->m_width)) {
          fVar20 = (float)((int)uVar13 + (int)uVar17) / 255.0;
          local_1d8.m_data[1] = 1.0;
          local_1d8.m_data[2] = 1.0;
          local_1d8.m_data[3] = 1.0;
          local_1d8.m_data[0] = fVar20;
          bVar9 = ComputeShaderBase::ColorEqual
                            ((ComputeShaderBase *)
                             (display.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start +
                             ((int)uVar16 + (int)uVar17)),&local_1d8,&kColorEps,epsilon);
          if (!bVar9) {
            anon_unknown_0::Output
                      ("Got red: %f , expected %f, at (%d, %d)",
                       (double)*(float *)&(((ComputeShaderBase *)
                                           (display.
                                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start +
                                           ((int)uVar16 + (int)uVar17)))->super_SubcaseBase).
                                          super_GLWrapper._vptr_GLWrapper,SUB84((double)fVar20,0),
                       uVar17 & 0xffffffff,uVar13 & 0xffffffff);
            goto LAB_00c1e1ae;
          }
        }
      }
      uVar16 = uVar16 + width;
    }
LAB_00c1e1ae:
    bVar9 = (long)(int)height <= (long)uVar13;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&display.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    std::_Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
    ::~_Vector_base(&data.
                     super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                   );
  }
  else {
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool RunIteration(const uvec3& local_size, const uvec3& num_groups, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size, num_groups));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		const GLint  kWidth  = static_cast<GLint>(local_size.x() * num_groups.x());
		const GLint  kHeight = static_cast<GLint>(local_size.y() * num_groups.y());
		const GLint  kDepth  = static_cast<GLint>(local_size.z() * num_groups.z());
		const GLuint kSize   = kWidth * kHeight * kDepth;

		std::vector<uvec4> data(kSize);
		glGenTextures(2, m_texture);

		for (int i = 0; i < 2; ++i)
		{
			glBindTexture(GL_TEXTURE_2D, m_texture[i]);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexStorage2D(GL_TEXTURE_2D, 1, GL_R32UI, kWidth, kHeight);
			glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, kWidth, kHeight, GL_RED_INTEGER, GL_UNSIGNED_INT, &data[0]);
		}
		glBindTexture(GL_TEXTURE_2D, 0);

		glBindImageTexture(0, m_texture[0], 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32UI);
		glBindImageTexture(1, m_texture[1], 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_R32UI);
		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups.x(), num_groups.y(), num_groups.z());
		}
		glMemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);

		glClear(GL_COLOR_BUFFER_BIT);
		glActiveTexture(GL_TEXTURE0);
		glBindTexture(GL_TEXTURE_2D, m_texture[0]);
		glActiveTexture(GL_TEXTURE1);
		glBindTexture(GL_TEXTURE_2D, m_texture[1]);
		glUseProgram(m_draw_program);
		glBindVertexArray(m_vertex_array);
		glViewport(0, 0, kWidth, kHeight);
		glDrawArraysInstanced(GL_TRIANGLE_STRIP, 0, 4, 1);

		std::vector<vec4>	display(kWidth * kHeight);
		std::vector<GLubyte> colorData(kWidth * kHeight * 4);
		glReadPixels(0, 0, kWidth, kHeight, GL_RGBA, GL_UNSIGNED_BYTE, &colorData[0]);
		glDeleteTextures(2, m_texture);

		for (int i = 0; i < kWidth * kHeight * 4; i += 4)
		{
			display[i / 4] =
				vec4(static_cast<GLfloat>(colorData[i] / 255.), static_cast<GLfloat>(colorData[i + 1] / 255.),
					 static_cast<GLfloat>(colorData[i + 2] / 255.), static_cast<GLfloat>(colorData[i + 3] / 255.));
		}

		/* As the colors are converted R8->Rx and then read back as Rx->R8,
		 need to add both conversions to the epsilon. */
		vec4 kColorEps = g_color_eps;
		kColorEps.x() += 1.f / ((1 << 8) - 1.0f);
		for (int y = 0; y < kHeight; ++y)
		{
			for (int x = 0; x < kWidth; ++x)
			{
				if (y >= getWindowHeight() || x >= getWindowWidth())
				{
					continue;
				}
				const vec4 c = vec4(float(y + x) / 255.0f, 1.0f, 1.0f, 1.0f);
				if (!ColorEqual(display[y * kWidth + x], c, kColorEps))
				{
					Output("Got red: %f , expected %f, at (%d, %d)", display[y * kWidth + x].x(), c.x(), x, y);
					return false;
				}
			}
		}

		return true;
	}